

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

CharFormat testing::internal::PrintAsCharLiteralTo<char32_t>(char32_t c,ostream *os)

{
  bool bVar1;
  char32_t c_00;
  fmtflags __fmtfl;
  ostream *this;
  void *pvVar2;
  ostream *in_RSI;
  char32_t in_EDI;
  fmtflags flags;
  char32_t u_c;
  
  c_00 = anon_unknown_31::ToChar32<char32_t>(in_EDI);
  switch(c_00) {
  case L'\0':
    std::operator<<(in_RSI,"\\0");
    break;
  default:
    bVar1 = IsPrintableAscii(c_00);
    if (!bVar1) {
      __fmtfl = std::ios_base::flags((ios_base *)(in_RSI + *(long *)(*(long *)in_RSI + -0x18)));
      this = std::operator<<(in_RSI,"\\x");
      pvVar2 = (void *)std::ostream::operator<<(this,std::hex);
      pvVar2 = (void *)std::ostream::operator<<(pvVar2,std::uppercase);
      std::ostream::operator<<(pvVar2,c_00);
      std::ios_base::flags((ios_base *)(in_RSI + *(long *)(*(long *)in_RSI + -0x18)),__fmtfl);
      return kHexEscape;
    }
    std::operator<<(in_RSI,(char)in_EDI);
    return kAsIs;
  case L'\a':
    std::operator<<(in_RSI,"\\a");
    break;
  case L'\b':
    std::operator<<(in_RSI,"\\b");
    break;
  case L'\t':
    std::operator<<(in_RSI,"\\t");
    break;
  case L'\n':
    std::operator<<(in_RSI,"\\n");
    break;
  case L'\v':
    std::operator<<(in_RSI,"\\v");
    break;
  case L'\f':
    std::operator<<(in_RSI,"\\f");
    break;
  case L'\r':
    std::operator<<(in_RSI,"\\r");
    break;
  case L'\'':
    std::operator<<(in_RSI,"\\\'");
    break;
  case L'\\':
    std::operator<<(in_RSI,"\\\\");
  }
  return kSpecialEscape;
}

Assistant:

static CharFormat PrintAsCharLiteralTo(Char c, ostream* os) {
  const char32_t u_c = ToChar32(c);
  switch (u_c) {
    case L'\0':
      *os << "\\0";
      break;
    case L'\'':
      *os << "\\'";
      break;
    case L'\\':
      *os << "\\\\";
      break;
    case L'\a':
      *os << "\\a";
      break;
    case L'\b':
      *os << "\\b";
      break;
    case L'\f':
      *os << "\\f";
      break;
    case L'\n':
      *os << "\\n";
      break;
    case L'\r':
      *os << "\\r";
      break;
    case L'\t':
      *os << "\\t";
      break;
    case L'\v':
      *os << "\\v";
      break;
    default:
      if (IsPrintableAscii(u_c)) {
        *os << static_cast<char>(c);
        return kAsIs;
      } else {
        ostream::fmtflags flags = os->flags();
        *os << "\\x" << std::hex << std::uppercase << static_cast<int>(u_c);
        os->flags(flags);
        return kHexEscape;
      }
  }
  return kSpecialEscape;
}